

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ArgumentsChecker *this;
  bool bVar1;
  char *pcVar2;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar3;
  typed_value<bool,_char> *ptVar4;
  basic_command_line_parser<char> *this_00;
  size_type sVar5;
  variable_value *pvVar6;
  bool *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  string *psVar9;
  ostream *poVar10;
  string local_3e8;
  undefined1 local_3c8 [8];
  DatFileUnpacker datFileUnpacker;
  ArgumentsChecker argumentsChecker;
  string local_380;
  allocator<char> local_359;
  string local_358;
  allocator<char> local_331;
  string local_330;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  undefined1 local_2c0 [8];
  Arguments arguments;
  exception *e;
  key_type local_260;
  basic_command_line_parser<char> local_240;
  basic_parsed_options<char> local_1c8;
  variables_map local_1a0 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_190 [149];
  bool local_fb;
  bool local_fa;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined8 local_d8 [3];
  allocator<char> local_b9;
  string local_b8 [32];
  options_description local_98 [8];
  options_description argumentsDescription;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"Arguments",&local_b9);
  boost::program_options::options_description::options_description
            (local_98,local_b8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_d8[0] = boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_d8,"help");
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"dat2",&local_f9);
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar3,&local_f8);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"format,f",(char *)ptVar3);
  ptVar4 = (typed_value<bool,_char> *)boost::program_options::bool_switch();
  local_fa = false;
  ptVar4 = boost::program_options::typed_value<bool,_char>::default_value(ptVar4,&local_fa);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"quiet,q",(char *)ptVar4);
  ptVar4 = (typed_value<bool,_char> *)boost::program_options::bool_switch();
  local_fb = false;
  ptVar4 = boost::program_options::typed_value<bool,_char>::default_value(ptVar4,&local_fb);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"transform,t",(char *)ptVar4);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar3);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"source,s",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar3);
  boost::program_options::options_description_easy_init::operator()
            (pcVar2,(value_semantic *)"destination,d",(char *)ptVar3);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  boost::program_options::variables_map::variables_map(local_1a0);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            (&local_240,argc,argv);
  this_00 = boost::program_options::basic_command_line_parser<char>::options(&local_240,local_98);
  boost::program_options::basic_command_line_parser<char>::run(&local_1c8,this_00);
  boost::program_options::store((basic_parsed_options *)&local_1c8,local_1a0,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_1c8);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser(&local_240);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"help",(allocator<char> *)((long)&e + 7));
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_190,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  if (sVar5 == 0) {
    boost::program_options::notify(local_1a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"quiet",&local_2e1);
    pvVar6 = boost::program_options::variables_map::operator[](local_1a0,&local_2e0);
    pbVar7 = boost::program_options::variable_value::as<bool>(pvVar6);
    local_2c0[0] = (bool)(*pbVar7 & 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"transform",&local_309);
    pvVar6 = boost::program_options::variables_map::operator[](local_1a0,&local_308);
    pbVar7 = boost::program_options::variable_value::as<bool>(pvVar6);
    local_2c0[1] = (bool)(*pbVar7 & 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"source",&local_331);
    pvVar6 = boost::program_options::variables_map::operator[](local_1a0,&local_330);
    pbVar8 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar6);
    std::__cxx11::string::string((string *)&arguments,(string *)pbVar8);
    argumentsChecker._errorMessage.field_2._M_local_buf[0xd] = '\x01';
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,"destination",&local_359);
    pvVar6 = boost::program_options::variables_map::operator[](local_1a0,&local_358);
    pbVar8 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar6);
    std::__cxx11::string::string
              ((string *)(arguments.source.field_2._M_local_buf + 8),(string *)pbVar8);
    argumentsChecker._errorMessage.field_2._M_local_buf[0xe] = '\x01';
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"format",
               (allocator<char> *)(argumentsChecker._errorMessage.field_2._M_local_buf + 0xf));
    pvVar6 = boost::program_options::variables_map::operator[](local_1a0,&local_380);
    pbVar8 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar6);
    bVar1 = std::operator==(pbVar8,"dat2");
    arguments.destination.field_2._8_4_ = bVar1 + 1;
    argumentsChecker._errorMessage.field_2._M_local_buf[0xe] = '\0';
    argumentsChecker._errorMessage.field_2._M_local_buf[0xd] = '\0';
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator
              ((allocator<char> *)(argumentsChecker._errorMessage.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator(&local_359);
    std::__cxx11::string::~string((string *)&local_330);
    std::allocator<char>::~allocator(&local_331);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator(&local_309);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
    this = (ArgumentsChecker *)((long)&datFileUnpacker._errorMessage.field_2 + 8);
    DatUnpacker::ArgumentsChecker::ArgumentsChecker(this);
    bVar1 = DatUnpacker::ArgumentsChecker::check(this,(Arguments *)local_2c0);
    if (bVar1) {
      DatUnpacker::DatFileUnpacker::DatFileUnpacker((DatFileUnpacker *)local_3c8);
      bVar1 = DatUnpacker::DatFileUnpacker::unpack
                        ((DatFileUnpacker *)local_3c8,(Arguments *)local_2c0);
      if (bVar1) {
        argv_local._4_4_ = 0;
      }
      else {
        if ((local_2c0[0] & 1U) == 0) {
          DatUnpacker::DatFileUnpacker::getErrorMessage_abi_cxx11_
                    (&local_3e8,(DatFileUnpacker *)local_3c8);
          poVar10 = std::operator<<((ostream *)&std::cerr,(string *)&local_3e8);
          poVar10 = (ostream *)
                    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_3e8);
        }
        argv_local._4_4_ = 1;
      }
      e._0_4_ = 1;
      DatUnpacker::DatFileUnpacker::~DatFileUnpacker((DatFileUnpacker *)local_3c8);
    }
    else {
      if ((local_2c0[0] & 1U) == 0) {
        psVar9 = DatUnpacker::ArgumentsChecker::getErrorMessage_abi_cxx11_
                           ((ArgumentsChecker *)((long)&datFileUnpacker._errorMessage.field_2 + 8));
        poVar10 = std::operator<<((ostream *)&std::cerr,(string *)psVar9);
        poVar10 = (ostream *)
                  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
      argv_local._4_4_ = 1;
      e._0_4_ = 1;
    }
    DatUnpacker::ArgumentsChecker::~ArgumentsChecker
              ((ArgumentsChecker *)((long)&datFileUnpacker._errorMessage.field_2 + 8));
    DatUnpacker::Arguments::~Arguments((Arguments *)local_2c0);
  }
  else {
    usage(local_98);
    argv_local._4_4_ = 1;
    e._0_4_ = 1;
  }
  boost::program_options::variables_map::~variables_map(local_1a0);
  boost::program_options::options_description::~options_description(local_98);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    namespace po = boost::program_options;

    po::options_description argumentsDescription("Arguments");
    argumentsDescription.add_options()
        ("help", "Produce help message")
        ("format,f", po::value<std::string>()->required()->default_value("dat2"), "Fallout DAT file format version. 'dat1' or 'dat2'. 'dat2' is default")
        ("quiet,q", po::bool_switch()->default_value(false), "Quite mode. Do not display anything")
        ("transform,t", po::bool_switch()->default_value(false), "Transform file names to lowercase")
        ("source,s", po::value<std::string>()->required(), "Path to the DAT file")
        ("destination,d", po::value<std::string>()->required(), "Where to extract files");

    po::variables_map vm;
    po::store(po::command_line_parser(argc, argv).options(argumentsDescription).run(), vm);

    if (vm.count("help")) {
      usage(argumentsDescription);
      return 1;
    }

    try {
      po::notify(vm);
    } catch (std::exception& e) {
      std::cout << "Error: " << e.what() << std::endl;
      usage(argumentsDescription);
      return 1;
    }

    Arguments arguments = {
        vm["quiet"].as<bool>(),
        vm["transform"].as<bool>(),
        vm["source"].as<std::string>(),
        vm["destination"].as<std::string>(),
        vm["format"].as<std::string>() == "dat2" ? Format::FALLOUT2 : Format::FALLOUT1
    };

    ArgumentsChecker argumentsChecker;
    if (!argumentsChecker.check(arguments)) {
        if (!arguments.quietMode) {
            std::cerr << argumentsChecker.getErrorMessage() << std::endl << std::endl;
        }
        return 1;
    }

    DatFileUnpacker datFileUnpacker;
    if (!datFileUnpacker.unpack(arguments)) {
        if (!arguments.quietMode) {
            std::cerr << datFileUnpacker.getErrorMessage() << std::endl << std::endl;
        }
        return 1;
    }

    return 0;
}